

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c++
# Opt level: O1

EncodingResult<kj::String> * __thiscall
kj::decodeUtf16(EncodingResult<kj::String> *__return_storage_ptr__,kj *this,
               ArrayPtr<const_char16_t> utf16)

{
  ushort uVar1;
  byte *pbVar2;
  undefined8 uVar3;
  int iVar4;
  uint uVar5;
  char16_t *pcVar6;
  byte bVar7;
  size_t sVar8;
  byte *pbVar9;
  bool bVar10;
  char16_t *pcVar11;
  char16_t *pcVar12;
  Vector<char> local_68;
  uint local_44;
  undefined8 local_40;
  EncodingResult<kj::String> *local_38;
  
  pcVar6 = utf16.ptr;
  bVar10 = false;
  local_68.builder.ptr =
       (char *)_::HeapArrayDisposer::allocateImpl
                         (1,0,(long)pcVar6 + 1,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0
                         );
  local_68.builder.endPtr = (char *)((byte *)local_68.builder.ptr + (long)pcVar6 + 1);
  local_68.builder.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_68.builder.pos = local_68.builder.ptr;
  if (pcVar6 != (char16_t *)0x0) {
    local_40 = 0;
    local_44 = 0x288f60;
    pcVar11 = (char16_t *)0x0;
    local_38 = __return_storage_ptr__;
    do {
      pcVar12 = (char16_t *)((long)pcVar11 + 1);
      uVar1 = *(ushort *)(this + (long)pcVar11 * 2);
      bVar7 = (byte)uVar1;
      if (uVar1 < 0x80) {
        if (local_68.builder.pos == local_68.builder.endPtr) {
          sVar8 = ((long)local_68.builder.endPtr - (long)local_68.builder.ptr) * 2;
          if (local_68.builder.endPtr == local_68.builder.ptr) {
            sVar8 = 4;
          }
          Vector<char>::setCapacity(&local_68,sVar8);
        }
        *local_68.builder.pos = bVar7;
        local_68.builder.pos = local_68.builder.pos + 1;
        pcVar11 = pcVar12;
      }
      else if (uVar1 < 0x800) {
        pbVar2 = (byte *)(local_68.builder.pos + (2 - (long)local_68.builder.ptr));
        if (local_68.builder.endPtr + -(long)local_68.builder.ptr < pbVar2) {
          pbVar9 = (byte *)((long)(local_68.builder.endPtr + -(long)local_68.builder.ptr) * 2);
          if (local_68.builder.endPtr == local_68.builder.ptr) {
            pbVar9 = (byte *)0x4;
          }
          if (pbVar9 < pbVar2) {
            pbVar9 = pbVar2;
          }
          Vector<char>::setCapacity(&local_68,(size_t)pbVar9);
        }
        *local_68.builder.pos = (byte)(uVar1 >> 6) | 0xc0;
        local_68.builder.pos[1] = bVar7 & 0x3f | 0x80;
        local_68.builder.pos = local_68.builder.pos + 2;
        pcVar11 = pcVar12;
      }
      else {
        if ((uVar1 & 0xf800) == 0xd800) {
          if (pcVar12 == pcVar6) {
            bVar10 = true;
          }
          else {
            bVar10 = true;
            if ((uVar1 & 0x400) == 0) {
              local_44 = (uint)*(ushort *)(this + (long)pcVar11 * 2 + 2);
              bVar10 = (local_44 & 0xfc00) != 0xdc00;
            }
          }
          uVar3 = 0xd801;
          if (!bVar10) {
            pbVar2 = (byte *)(local_68.builder.pos + (4 - (long)local_68.builder.ptr));
            if (local_68.builder.endPtr + -(long)local_68.builder.ptr < pbVar2) {
              pbVar9 = (byte *)((long)(local_68.builder.endPtr + -(long)local_68.builder.ptr) * 2);
              if (local_68.builder.endPtr == local_68.builder.ptr) {
                pbVar9 = (byte *)0x4;
              }
              if (pbVar9 < pbVar2) {
                pbVar9 = pbVar2;
              }
              Vector<char>::setCapacity(&local_68,(size_t)pbVar9);
            }
            iVar4 = (uVar1 & 0x3ff) * 0x400;
            uVar5 = iVar4 + (local_44 & 0x3ff) + 0x10000;
            *local_68.builder.pos = (byte)(uVar5 >> 0x12) | 0xf0;
            local_68.builder.pos[1] = (byte)(uVar5 >> 0xc) & 0x3f | 0x80;
            local_68.builder.pos[2] = (byte)(iVar4 + (local_44 & 0x3ff) >> 6) & 0x3f | 0x80;
            local_68.builder.pos[3] = (byte)local_44 & 0x3f | 0x80;
            local_68.builder.pos = local_68.builder.pos + 4;
            pcVar12 = pcVar11 + 1;
            uVar3 = local_40;
          }
          pcVar11 = pcVar12;
          local_40 = uVar3;
          if (!bVar10) goto LAB_0020d602;
        }
        pcVar11 = pcVar12;
        pbVar2 = (byte *)(local_68.builder.pos + (3 - (long)local_68.builder.ptr));
        if (local_68.builder.endPtr + -(long)local_68.builder.ptr < pbVar2) {
          pbVar9 = (byte *)((long)(local_68.builder.endPtr + -(long)local_68.builder.ptr) * 2);
          if (local_68.builder.endPtr == local_68.builder.ptr) {
            pbVar9 = (byte *)0x4;
          }
          if (pbVar9 < pbVar2) {
            pbVar9 = pbVar2;
          }
          Vector<char>::setCapacity(&local_68,(size_t)pbVar9);
        }
        *local_68.builder.pos = (byte)(uVar1 >> 0xc) | 0xe0;
        local_68.builder.pos[1] = (byte)(uVar1 >> 6) & 0x3f | 0x80;
        local_68.builder.pos[2] = bVar7 & 0x3f | 0x80;
        local_68.builder.pos = local_68.builder.pos + 3;
      }
LAB_0020d602:
    } while (pcVar11 < pcVar6);
    bVar10 = (bool)((byte)local_40 & 1);
    __return_storage_ptr__ = local_38;
  }
  if (local_68.builder.pos == local_68.builder.endPtr) {
    sVar8 = 4;
    if (local_68.builder.endPtr != local_68.builder.ptr) {
      sVar8 = ((long)local_68.builder.endPtr - (long)local_68.builder.ptr) * 2;
    }
    Vector<char>::setCapacity(&local_68,sVar8);
  }
  *local_68.builder.pos = 0;
  local_68.builder.pos = local_68.builder.pos + 1;
  if (local_68.builder.pos != local_68.builder.endPtr) {
    Vector<char>::setCapacity(&local_68,(long)local_68.builder.pos - (long)local_68.builder.ptr);
  }
  (__return_storage_ptr__->super_String).content.ptr = local_68.builder.ptr;
  (__return_storage_ptr__->super_String).content.size_ =
       (long)local_68.builder.pos - (long)local_68.builder.ptr;
  (__return_storage_ptr__->super_String).content.disposer = local_68.builder.disposer;
  __return_storage_ptr__->hadErrors = bVar10;
  return __return_storage_ptr__;
}

Assistant:

EncodingResult<String> decodeUtf16(ArrayPtr<const char16_t> utf16) {
  Vector<char> result(utf16.size() + 1);
  bool hadErrors = false;

  size_t i = 0;
  while (i < utf16.size()) {
    char16_t u = utf16[i++];

    if (u < 0x80) {
      result.add(u);
      continue;
    } else if (u < 0x0800) {
      result.addAll<std::initializer_list<char>>({
        static_cast<char>(((u >>  6)       ) | 0xc0),
        static_cast<char>(((u      ) & 0x3f) | 0x80)
      });
      continue;
    } else if ((u & 0xf800) == 0xd800) {
      // surrogate pair
      char16_t u2;
      if (KJ_UNLIKELY(i == utf16.size()                         // missing second half
                   || (u & 0x0400) != 0                         // first half in wrong range
                   || ((u2 = utf16[i]) & 0xfc00) != 0xdc00)) {  // second half in wrong range
        hadErrors = true;
        goto threeByte;
      }
      ++i;

      char32_t u32 = (((u & 0x03ff) << 10) | (u2 & 0x03ff)) + 0x10000;
      result.addAll<std::initializer_list<char>>({
        static_cast<char>(((u32 >> 18)       ) | 0xf0),
        static_cast<char>(((u32 >> 12) & 0x3f) | 0x80),
        static_cast<char>(((u32 >>  6) & 0x3f) | 0x80),
        static_cast<char>(((u32      ) & 0x3f) | 0x80)
      });
      continue;
    } else {
    threeByte:
      result.addAll<std::initializer_list<char>>({
        static_cast<char>(((u >> 12)       ) | 0xe0),
        static_cast<char>(((u >>  6) & 0x3f) | 0x80),
        static_cast<char>(((u      ) & 0x3f) | 0x80)
      });
      continue;
    }
  }

  result.add(0);
  return { String(result.releaseAsArray()), hadErrors };
}